

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringutils.h
# Opt level: O3

string * hexstring<unsigned_char*>(string *__return_storage_ptr__,uchar *buf,int nLength,char sep)

{
  char cVar1;
  long lVar2;
  pointer p;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (nLength == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    cVar1 = (char)nLength + -1;
    if (sep == '\0') {
      cVar1 = '\0';
    }
    std::__cxx11::string::resize((ulong)__return_storage_ptr__,cVar1 + (char)nLength * '\x02');
    p = (__return_storage_ptr__->_M_dataplus)._M_p;
    lVar2 = 0;
    do {
      byte2hexchars(buf[lVar2],p);
      if (nLength + -1 == (int)lVar2 || sep == '\0') {
        p = p + 2;
      }
      else {
        p[2] = sep;
        p = p + 3;
      }
      lVar2 = lVar2 + 1;
    } while (nLength != (int)lVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string hexstring(I buf, int nLength, char sep=0)
{
    if (nLength==0)
        return "";
    std::string str;
    str.resize(nLength*2+(sep ? (nLength-1):0));
    char *p= &str[0];
    while(nLength--)
    {
        byte2hexchars(*buf++, p); p+=2;
        if (sep && nLength)
            *p++ = sep;
    }
    return str;
}